

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::Mine::ClearWireVertices(Mine *this,KUINT16 Index)

{
  pointer ppVar1;
  _Rb_tree_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
  local_20;
  iterator itr;
  KUINT16 Index_local;
  Mine *this_local;
  
  itr._M_node._6_2_ = Index;
  local_20._M_node = (_Base_ptr)getWire(this,Index);
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
           ::operator->(&local_20);
  std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::clear
            (&ppVar1->second);
  return;
}

Assistant:

void Mine::ClearWireVertices(KUINT16 Index) noexcept(false)
{
    map< KUINT16, vector<Vector> >::iterator itr = getWire( Index );
    itr->second.clear();
}